

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

void divide_subset_split(size_t *ix_arr,int *x,size_t st,size_t end,char *split_categ,int ncat,
                        MissingAction missing_action,NewCategAction new_cat_action,
                        bool move_new_to_left,size_t *st_NA,size_t *end_NA,size_t *split_ix)

{
  size_t sVar1;
  size_t row_3;
  int iVar2;
  uint uVar3;
  size_t row;
  ulong uVar4;
  size_t row_2;
  size_t sVar5;
  bool bVar6;
  
  if (new_cat_action != Weighted && missing_action == Fail) {
    if (move_new_to_left && new_cat_action == Smallest) {
      uVar4 = st;
      if (st <= end) {
        do {
          if (((ncat <= x[ix_arr[uVar4]]) || (split_categ[x[ix_arr[uVar4]]] == -1)) ||
             (split_categ[x[ix_arr[uVar4]]] == '\x01')) {
            sVar5 = ix_arr[st];
            ix_arr[st] = ix_arr[uVar4];
            ix_arr[uVar4] = sVar5;
            st = st + 1;
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 <= end);
      }
    }
    else if (new_cat_action == Random) {
      uVar4 = st;
      if (st <= end) {
        do {
          iVar2 = x[ix_arr[uVar4]];
          if (ncat <= iVar2) {
            iVar2 = iVar2 % ncat;
          }
          if (split_categ[iVar2] == '\x01') {
            sVar5 = ix_arr[st];
            ix_arr[st] = ix_arr[uVar4];
            ix_arr[uVar4] = sVar5;
            st = st + 1;
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 <= end);
      }
    }
    else {
      uVar4 = st;
      if (st <= end) {
        do {
          if ((x[ix_arr[uVar4]] < ncat) && (split_categ[x[ix_arr[uVar4]]] == '\x01')) {
            sVar5 = ix_arr[st];
            ix_arr[st] = ix_arr[uVar4];
            ix_arr[uVar4] = sVar5;
            st = st + 1;
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 <= end);
      }
    }
    *split_ix = st;
    return;
  }
  if (new_cat_action == Smallest) {
    if (!move_new_to_left) goto LAB_001532b6;
    uVar4 = st;
    if (st <= end) {
      do {
        iVar2 = x[ix_arr[uVar4]];
        if ((-1 < (long)iVar2) &&
           (((ncat <= iVar2 || (split_categ[iVar2] == -1)) || (split_categ[iVar2] == '\x01')))) {
          sVar5 = ix_arr[st];
          ix_arr[st] = ix_arr[uVar4];
          ix_arr[uVar4] = sVar5;
          st = st + 1;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 <= end);
      goto LAB_001534b2;
    }
    *st_NA = st;
    bVar6 = missing_action == Divide;
LAB_00153508:
    uVar4 = st;
    if (bVar6) {
      for (; uVar4 <= end; uVar4 = uVar4 + 1) {
        if (x[ix_arr[uVar4]] < 0) {
          sVar5 = ix_arr[st];
          ix_arr[st] = ix_arr[uVar4];
          ix_arr[uVar4] = sVar5;
          st = st + 1;
        }
      }
    }
  }
  else {
    if (new_cat_action == Random) {
      sVar5 = st;
      if (missing_action == Impute && !move_new_to_left) {
        if (end < st) {
          *st_NA = st;
          goto LAB_0015346a;
        }
        do {
          uVar3 = x[ix_arr[st]];
          if (ncat <= (int)uVar3) {
            uVar3 = (int)uVar3 % ncat;
          }
          if (((int)uVar3 < 0) || (split_categ[uVar3] == '\x01')) {
            sVar1 = ix_arr[sVar5];
            ix_arr[sVar5] = ix_arr[st];
            ix_arr[st] = sVar1;
            sVar5 = sVar5 + 1;
          }
          st = st + 1;
        } while (st <= end);
      }
      else if (st <= end) {
        do {
          uVar3 = x[ix_arr[st]];
          if (ncat <= (int)uVar3) {
            uVar3 = (int)uVar3 % ncat;
          }
          if ((-1 < (int)uVar3) && (split_categ[uVar3] == '\x01')) {
            sVar1 = ix_arr[sVar5];
            ix_arr[sVar5] = ix_arr[st];
            ix_arr[st] = sVar1;
            sVar5 = sVar5 + 1;
          }
          st = st + 1;
        } while (st <= end);
      }
      st = sVar5;
      *st_NA = st;
      uVar4 = st;
      if ((missing_action != Impute || move_new_to_left) && st <= end) {
        do {
          if (x[ix_arr[uVar4]] < 0) {
            sVar5 = ix_arr[st];
            ix_arr[st] = ix_arr[uVar4];
            ix_arr[uVar4] = sVar5;
            st = st + 1;
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 <= end);
      }
LAB_0015346a:
      *end_NA = st;
      return;
    }
LAB_001532b6:
    if (missing_action == Impute && !move_new_to_left) {
      uVar4 = st;
      if (st <= end) {
        do {
          uVar3 = x[ix_arr[uVar4]];
          if (((int)uVar3 < ncat) && (((int)uVar3 < 0 || (split_categ[uVar3] == '\x01')))) {
            sVar5 = ix_arr[st];
            ix_arr[st] = ix_arr[uVar4];
            ix_arr[uVar4] = sVar5;
            st = st + 1;
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 <= end);
        goto LAB_001534b2;
      }
      *st_NA = st;
      if (new_cat_action != Weighted) {
        bVar6 = false;
        goto LAB_00153508;
      }
    }
    else {
      uVar4 = st;
      if (st <= end) {
        do {
          uVar3 = x[ix_arr[uVar4]];
          if (((int)uVar3 < ncat && -1 < (int)uVar3) && (split_categ[uVar3] == '\x01')) {
            sVar5 = ix_arr[st];
            ix_arr[st] = ix_arr[uVar4];
            ix_arr[uVar4] = sVar5;
            st = st + 1;
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 <= end);
      }
LAB_001534b2:
      *st_NA = st;
      bVar6 = missing_action == Divide;
      uVar4 = st;
      if (missing_action == Divide && new_cat_action == Weighted) {
        for (; uVar4 <= end; uVar4 = uVar4 + 1) {
          uVar3 = x[ix_arr[uVar4]];
          if ((ncat <= (int)uVar3 || (int)uVar3 < 0) || (split_categ[uVar3] == -1)) {
            sVar5 = ix_arr[st];
            ix_arr[st] = ix_arr[uVar4];
            ix_arr[uVar4] = sVar5;
            st = st + 1;
          }
        }
        goto LAB_00153545;
      }
      if (new_cat_action != Weighted) goto LAB_00153508;
    }
    for (; uVar4 <= end; uVar4 = uVar4 + 1) {
      iVar2 = x[ix_arr[uVar4]];
      if ((-1 < (long)iVar2) && ((ncat <= iVar2 || (split_categ[iVar2] == -1)))) {
        sVar5 = ix_arr[st];
        ix_arr[st] = ix_arr[uVar4];
        ix_arr[uVar4] = sVar5;
        st = st + 1;
      }
    }
  }
LAB_00153545:
  *end_NA = st;
  return;
}

Assistant:

void divide_subset_split(size_t *restrict ix_arr, int x[], size_t st, size_t end, signed char split_categ[],
                         int ncat, MissingAction missing_action, NewCategAction new_cat_action,
                         bool move_new_to_left, size_t &restrict st_NA, size_t &restrict end_NA, size_t &restrict split_ix) noexcept
{
    size_t temp;
    int cval;

    /* if NAs are not to be bothered with, just need to do a single pass */
    if (missing_action == Fail && new_cat_action != Weighted)
    {
        /* in this case, will need to fill 'split_ix', otherwise need to fill 'st_NA' and 'end_NA' */
        if (new_cat_action == Smallest && move_new_to_left)
        {
            for (size_t row = st; row <= end; row++)
            {
                cval = x[ix_arr[row]];
                if (cval >= ncat || split_categ[cval] == 1 || split_categ[cval] == (-1))
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }

        else if (new_cat_action == Random)
        {
            for (size_t row = st; row <= end; row++)
            {
                cval = x[ix_arr[row]];
                cval = (cval >= ncat)? (cval % ncat) : cval;
                if (split_categ[cval] == 1)
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }

        else
        {
            for (size_t row = st; row <= end; row++)
            {
                cval = x[ix_arr[row]];
                if (cval < ncat && split_categ[cval] == 1)
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }

        split_ix = st;
    }

    /* if there are new categories, and their direction was decided at random,
       can just reuse what was randomly decided for previous columns by taking
       a remainder w.r.t. the number of previous columns. Note however that this
       will not be an unbiased decision if the model used a gain criterion. */
    else if (new_cat_action == Random)
    {
        if (missing_action == Impute && !move_new_to_left)
        {
            for (size_t row = st; row <= end; row++)
            {
                cval = x[ix_arr[row]];
                cval = (cval >= ncat)? (cval % ncat) : cval;
                if (cval < 0 || split_categ[cval] == 1)
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }

        else
        {
            for (size_t row = st; row <= end; row++)
            {
                cval = x[ix_arr[row]];
                cval = (cval >= ncat)? (cval % ncat) : cval;
                if (cval >= 0 && split_categ[cval] == 1)
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }
        st_NA = st;

        if (!(missing_action == Impute && !move_new_to_left))
        {
            for (size_t row = st; row <= end; row++)
            {
                if (unlikely(x[ix_arr[row]] < 0))
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }
        end_NA = st;
    }

    /* otherwise, first put to the left all l.e. and not NA, then all NAs to the end of the left */
    else
    {
        /* Note: if having 'new_cat_action'='Smallest' and 'missing_action'='Impute', missing values
           and new categories will necessarily go into different branches, thus it's possible to do
           all the movements in one pass if certain conditions match. */

        if (new_cat_action == Smallest && move_new_to_left)
        {
            for (size_t row = st; row <= end; row++)
            {
                cval = x[ix_arr[row]];
                if (cval >= 0 && (cval >= ncat || split_categ[cval] == 1 || split_categ[cval] == (-1)))
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }

        else if (missing_action == Impute && !move_new_to_left)
        {
            for (size_t row = st; row <= end; row++)
            {
                cval = x[ix_arr[row]];
                if (cval < ncat && (cval < 0 || split_categ[cval] == 1))
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }

        else
        {
            for (size_t row = st; row <= end; row++)
            {
                cval = x[ix_arr[row]];
                if (cval >= 0 && cval < ncat && split_categ[cval] == 1)
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }

        st_NA = st;

        if (new_cat_action == Weighted && missing_action == Divide)
        {
            for (size_t row = st; row <= end; row++)
            {
                cval = x[ix_arr[row]];
                if (cval < 0 || cval >= ncat || split_categ[cval] == (-1))
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }

        else if (new_cat_action == Weighted)
        {
            for (size_t row = st; row <= end; row++)
            {
                cval = x[ix_arr[row]];
                if (cval >= 0 && (cval >= ncat || split_categ[cval] == (-1)))
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }

        else if (missing_action == Divide)
        {
            for (size_t row = st; row <= end; row++)
            {
                if (unlikely(x[ix_arr[row]] < 0))
                {
                    temp        = ix_arr[st];
                    ix_arr[st]  = ix_arr[row];
                    ix_arr[row] = temp;
                    st++;
                }
            }
        }

        end_NA = st;
    }
}